

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

int __thiscall smf::Options::getInt(Options *this,string *optionName)

{
  char *__nptr;
  long lVar1;
  string local_38;
  string *local_18;
  string *optionName_local;
  Options *this_local;
  
  local_18 = optionName;
  optionName_local = (string *)this;
  getString(&local_38,this,optionName);
  __nptr = (char *)std::__cxx11::string::c_str();
  lVar1 = strtol(__nptr,(char **)0x0,0);
  std::__cxx11::string::~string((string *)&local_38);
  return (int)lVar1;
}

Assistant:

int Options::getInt(const std::string& optionName) {
	return (int)strtol(getString(optionName).c_str(), (char**)NULL, 0);
}